

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_context * dropt_new_context(dropt_option *options)

{
  _Bool _Var1;
  char *pcVar2;
  undefined1 local_80 [8];
  dropt_context emptyContext;
  size_t n;
  dropt_context *context;
  dropt_option *options_local;
  
  n = 0;
  if (options == (dropt_option *)0x0) {
    dropt_misuse("No option list specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x58d);
  }
  else {
    emptyContext.ncmpstr = (dropt_strncmp_func)0x0;
    while (_Var1 = is_valid_option(options + (long)emptyContext.ncmpstr), _Var1) {
      if ((options[(long)emptyContext.ncmpstr].short_name == '=') ||
         ((options[(long)emptyContext.ncmpstr].long_name != (dropt_char *)0x0 &&
          (pcVar2 = strchr(options[(long)emptyContext.ncmpstr].long_name,0x3d),
          pcVar2 != (char *)0x0)))) {
        dropt_misuse("Invalid option list. \'=\' may not be used in an option name.",
                     "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                     ,0x598);
        return (dropt_context *)0x0;
      }
      emptyContext.ncmpstr = emptyContext.ncmpstr + 1;
    }
    n = (size_t)malloc(0x60);
    if ((dropt_context *)n != (dropt_context *)0x0) {
      memset(local_80,0,0x60);
      memcpy((void *)n,local_80,0x60);
      ((dropt_context *)n)->options = options;
      ((dropt_context *)n)->numOptions = (size_t)emptyContext.ncmpstr;
      dropt_set_strncmp((dropt_context *)n,(dropt_strncmp_func)0x0);
    }
  }
  return (dropt_context *)n;
}

Assistant:

dropt_context*
dropt_new_context(const dropt_option* options)
{
    dropt_context* context = NULL;
    size_t n;

    if (options == NULL)
    {
        DROPT_MISUSE("No option list specified.");
        goto exit;
    }

    /* Sanity-check the options. */
    for (n = 0; is_valid_option(&options[n]); n++)
    {
        if (   options[n].short_name == DROPT_TEXT_LITERAL('=')
            || (   options[n].long_name != NULL
                && dropt_strchr(options[n].long_name, DROPT_TEXT_LITERAL('=')) != NULL))
        {
            DROPT_MISUSE("Invalid option list. '=' may not be used in an option name.");
            goto exit;
        }
    }

    context = malloc(sizeof *context);
    if (context == NULL)
    {
        goto exit;
    }
    else
    {
        dropt_context emptyContext = { 0 };
        *context = emptyContext;

        context->options = options;
        context->numOptions = n;
        dropt_set_strncmp(context, NULL);
    }

exit:
    return context;
}